

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O3

string * __thiscall
OpenMD::RNEMD::RNEMD::setSelection_abi_cxx11_
          (string *__return_storage_ptr__,RNEMD *this,RealType *slabCenter)

{
  double *pdVar1;
  double dVar2;
  RealType RVar3;
  RNEMDPrivilegedAxis RVar4;
  double dVar5;
  ostream *poVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ostringstream selectionStream;
  Vector3d local_1f8;
  Vector3d local_1d8;
  Vector3d local_1b8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  local_1f8.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
  local_1f8.super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
  local_1f8.super_Vector<double,_3U>.data_[1] = (double)OpenMD::V3Zero._8_8_;
  dVar2 = *slabCenter;
  uVar8 = SUB84(dVar2,0);
  uVar9 = (undefined4)((ulong)dVar2 >> 0x20);
  uVar7 = (ulong)this->rnemdPrivilegedAxis_;
  local_1f8.super_Vector<double,_3U>.data_[uVar7] = dVar2;
  dVar5 = *(double *)
           ((long)(this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
           + uVar7 * 0x20) * 0.5;
  if ((dVar5 < dVar2) || (dVar2 < -dVar5)) {
    Snapshot::wrapVector(this->currentSnap_,&local_1f8);
    snprintf(painCave.errMsg,2000,
             "The given slab center was set to %0.2f. In the wrapped coordinates\n\t[-Hmat/2, +Hmat/2], this has been remapped to %0.2f.\n"
             ,SUB84(*slabCenter,0),
             SUB84(local_1f8.super_Vector<double,_3U>.data_[this->rnemdPrivilegedAxis_],0));
    painCave.isFatal = 0;
    painCave.severity = 2;
    simError();
    uVar7 = (ulong)this->rnemdPrivilegedAxis_;
    RVar3 = local_1f8.super_Vector<double,_3U>.data_[uVar7];
    uVar8 = SUB84(RVar3,0);
    uVar9 = (undefined4)((ulong)RVar3 >> 0x20);
    *slabCenter = RVar3;
  }
  local_1b8.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
  local_1b8.super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
  local_1b8.super_Vector<double,_3U>.data_[1] = (double)OpenMD::V3Zero._8_8_;
  local_1b8.super_Vector<double,_3U>.data_[uVar7] =
       this->slabWidth_ * -0.5 + (double)CONCAT44(uVar9,uVar8);
  Snapshot::wrapVector(this->currentSnap_,&local_1b8);
  local_1d8.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
  local_1d8.super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
  local_1d8.super_Vector<double,_3U>.data_[1] = (double)OpenMD::V3Zero._8_8_;
  RVar4 = this->rnemdPrivilegedAxis_;
  local_1d8.super_Vector<double,_3U>.data_[RVar4] = this->slabWidth_ * 0.5 + *slabCenter;
  Snapshot::wrapVector(this->currentSnap_,&local_1d8);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"select wrapped",0xe);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(this->rnemdAxisLabel_)._M_dataplus._M_p,
                      (this->rnemdAxisLabel_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," >= ",4);
  std::ostream::_M_insert<double>(local_1b8.super_Vector<double,_3U>.data_[uVar7]);
  dVar2 = local_1b8.super_Vector<double,_3U>.data_[uVar7];
  pdVar1 = local_1d8.super_Vector<double,_3U>.data_ + RVar4;
  if (dVar2 < *pdVar1 || dVar2 == *pdVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," && wrapped",0xb);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(this->rnemdAxisLabel_)._M_dataplus._M_p,
                        (this->rnemdAxisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," < ",3);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," || wrapped",0xb);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(this->rnemdAxisLabel_)._M_dataplus._M_p,
                        (this->rnemdAxisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," < ",3);
  }
  std::ostream::_M_insert<double>(local_1d8.super_Vector<double,_3U>.data_[RVar4]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string RNEMD::setSelection(RealType& slabCenter) {
    bool printSlabCenterWarning {false};

    Vector3d tempSlabCenter {V3Zero};
    tempSlabCenter[rnemdPrivilegedAxis_] = slabCenter;

    RealType hmat_2 = hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) / 2.0;

    if (slabCenter > hmat_2) {
      currentSnap_->wrapVector(tempSlabCenter);
      printSlabCenterWarning = true;
    } else if (slabCenter < -hmat_2) {
      currentSnap_->wrapVector(tempSlabCenter);
      printSlabCenterWarning = true;
    }

    if (printSlabCenterWarning) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "The given slab center was set to %0.2f. In the wrapped "
               "coordinates\n"
               "\t[-Hmat/2, +Hmat/2], this has been remapped to %0.2f.\n",
               slabCenter, tempSlabCenter[rnemdPrivilegedAxis_]);
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_WARNING;
      simError();

      slabCenter = tempSlabCenter[rnemdPrivilegedAxis_];
    }

    Vector3d leftSlab {V3Zero};
    const RealType& leftSlabBoundary = leftSlab[rnemdPrivilegedAxis_];
    leftSlab[rnemdPrivilegedAxis_]   = slabCenter - 0.5 * slabWidth_;
    currentSnap_->wrapVector(leftSlab);

    Vector3d rightSlab {V3Zero};
    const RealType& rightSlabBoundary = rightSlab[rnemdPrivilegedAxis_];
    rightSlab[rnemdPrivilegedAxis_]   = slabCenter + 0.5 * slabWidth_;
    currentSnap_->wrapVector(rightSlab);

    std::ostringstream selectionStream;

    selectionStream << "select wrapped" << rnemdAxisLabel_
                    << " >= " << leftSlabBoundary;

    if (leftSlabBoundary > rightSlabBoundary)
      selectionStream << " || wrapped" << rnemdAxisLabel_ << " < "
                      << rightSlabBoundary;
    else
      selectionStream << " && wrapped" << rnemdAxisLabel_ << " < "
                      << rightSlabBoundary;

    return selectionStream.str();
  }